

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::IsEnabledVerifier::verifyBoolean
          (IsEnabledVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  qpTestResult qVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  undefined1 local_1f;
  GLboolean local_1e;
  byte local_1d;
  GLenum local_1c;
  GLboolean expectedGLState;
  GLboolean state;
  bool reference_local;
  TestContext *pTStack_18;
  GLenum name_local;
  TestContext *testCtx_local;
  IsEnabledVerifier *this_local;
  
  local_1d = reference;
  local_1c = name;
  pTStack_18 = testCtx;
  testCtx_local = (TestContext *)this;
  local_1e = glu::CallLogWrapper::glIsEnabled
                       (&(this->super_StateVerifier).super_CallLogWrapper,name);
  local_1f = (local_1d & 1) != 0;
  if (local_1e != local_1f) {
    this_00 = tcu::TestContext::getLog(pTStack_18);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [20])"// ERROR: expected ");
    local_1b8[0] = "GL_FALSE";
    if ((local_1d & 1) != 0) {
      local_1b8[0] = "GL_TRUE";
    }
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar1 = tcu::TestContext::getTestResult(pTStack_18);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTStack_18,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void IsEnabledVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	const GLboolean state = glIsEnabled(name);
	const GLboolean expectedGLState = reference ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (reference ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}